

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_Floor_Test::
~ArenaAlignDefault_Floor_Test(ArenaAlignDefault_Floor_Test *this)

{
  ArenaAlignDefault_Floor_Test *this_local;
  
  ~ArenaAlignDefault_Floor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ArenaAlignDefault, Floor) {
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.Floor(0), Eq(0));
  EXPECT_THAT(align_default.Floor(1), Eq(0));
  EXPECT_THAT(align_default.Floor(7), Eq(0));
  EXPECT_THAT(align_default.Floor(8), Eq(8));
  EXPECT_THAT(align_default.Floor(9), Eq(8));
  EXPECT_THAT(align_default.Floor(15), Eq(8));
  EXPECT_THAT(align_default.Floor(16), Eq(16));
}